

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemImpl.cpp
# Opt level: O2

FileInfoMap *
efsw::Platform::FileSystem::filesInfoFromPath(FileInfoMap *__return_storage_ptr__,string *path)

{
  _Rb_tree_header *p_Var1;
  DIR *__dirp;
  dirent *pdVar2;
  mapped_type *this;
  string fpath;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_b8;
  key_type local_98;
  FileInfo local_78;
  
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  __dirp = opendir((path->_M_dataplus)._M_p);
  if (__dirp != (DIR *)0x0) {
    while( true ) {
      pdVar2 = readdir(__dirp);
      if (pdVar2 == (dirent *)0x0) break;
      if ((pdVar2->d_name[0] != '.') ||
         (((pdVar2->d_name[1] != '.' || (pdVar2->d_name[2] != '\0')) && (pdVar2->d_name[1] != '\0'))
         )) {
        std::__cxx11::string::string((string *)&local_98,pdVar2->d_name,(allocator *)&local_78);
        std::operator+(&bStack_b8,path,&local_98);
        FileInfo::FileInfo(&local_78,&bStack_b8);
        this = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
               ::operator[](__return_storage_ptr__,&local_98);
        FileInfo::operator=(this,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&bStack_b8);
        std::__cxx11::string::~string((string *)&local_98);
      }
    }
    closedir(__dirp);
  }
  return __return_storage_ptr__;
}

Assistant:

FileInfoMap FileSystem::filesInfoFromPath( const std::string& path ) {
	FileInfoMap files;

	DIR* dp;
	struct dirent* dirp;

	if ( ( dp = opendir( path.c_str() ) ) == NULL )
		return files;

	while ( ( dirp = readdir( dp ) ) != NULL ) {
		if ( strcmp( dirp->d_name, ".." ) != 0 && strcmp( dirp->d_name, "." ) != 0 ) {
			std::string name( dirp->d_name );
			std::string fpath( path + name );

			files[name] = FileInfo( fpath );
		}
	}

	closedir( dp );

	return files;
}